

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_embedded_struct_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               flatcc_json_printer_struct_f *pf)

{
  char *pcVar1;
  size_t len_local;
  char *name_local;
  size_t offset_local;
  void *p_local;
  int index_local;
  flatcc_json_printer_t *ctx_local;
  
  if (index != 0) {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ',';
  }
  print_name(ctx,name,len);
  ctx->level = ctx->level + 1;
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '{';
  (*pf)(ctx,(void *)((long)p + offset));
  if (ctx->indent != '\0') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\n';
    ctx->level = ctx->level + -1;
    print_indent(ctx);
  }
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '}';
  return;
}

Assistant:

void flatcc_json_printer_embedded_struct_field(flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len,
        flatcc_json_printer_struct_f pf)
{
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('{');
    pf(ctx, (uint8_t *)p + offset);
    print_end('}');
}